

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-formatter-test.cc
# Opt level: O1

string * custom_vformat_abi_cxx11_
                   (string *__return_storage_ptr__,string_view format_str,format_args args)

{
  undefined **local_230;
  undefined1 *local_228;
  long lStack_220;
  undefined8 local_218;
  undefined1 local_210 [504];
  
  lStack_220 = 0;
  local_230 = &PTR_grow_00169008;
  local_218 = 500;
  local_228 = local_210;
  fmt::v5::
  vformat_to<custom_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_230,format_str,
             args.
             super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  local_230 = &PTR_grow_00169008;
  if (local_228 != local_210) {
    operator_delete(local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string custom_vformat(fmt::string_view format_str, fmt::format_args args) {
  fmt::memory_buffer buffer;
  // Pass custom argument formatter as a template arg to vwrite.
  fmt::vformat_to<custom_arg_formatter>(buffer, format_str, args);
  return std::string(buffer.data(), buffer.size());
}